

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

double brcomp(double *a,double *b,double *x,double *y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double local_48;
  
  dVar4 = 0.0;
  if (((*x != 0.0) || (NAN(*x))) && ((*y != 0.0 || (NAN(*y))))) {
    brcomp::a0 = *a;
    if (*b <= *a) {
      brcomp::a0 = *b;
    }
    if (8.0 <= brcomp::a0) {
      dVar4 = *a;
      dVar9 = *b;
      if (dVar4 <= dVar9) {
        dVar5 = dVar4 / dVar9 + 1.0;
        auVar11._8_8_ = dVar4 / dVar9;
        auVar11._0_8_ = 0x3ff0000000000000;
        auVar8._8_8_ = dVar5;
        auVar8._0_8_ = dVar5;
        auVar8 = divpd(auVar11,auVar8);
        brcomp::lambda = dVar4 - (dVar4 + dVar9) * *x;
      }
      else {
        auVar10._0_8_ = dVar9 / dVar4;
        auVar10._8_8_ = 0x3ff0000000000000;
        auVar2._8_8_ = auVar10._0_8_ + 1.0;
        auVar2._0_8_ = auVar10._0_8_ + 1.0;
        auVar8 = divpd(auVar10,auVar2);
        brcomp::lambda = (dVar4 + dVar9) * *y - dVar9;
      }
      brcomp::x0 = auVar8._8_8_;
      brcomp::y0 = auVar8._0_8_;
      dVar4 = -brcomp::lambda / dVar4;
      brcomp::e = dVar4;
      if (ABS(dVar4) <= 0.6) {
        brcomp::u = rlog1(&brcomp::e);
      }
      else {
        dVar9 = log(*x / brcomp::x0);
        brcomp::u = dVar4 - dVar9;
      }
      dVar4 = brcomp::lambda / *b;
      brcomp::e = dVar4;
      if (ABS(dVar4) <= 0.6) {
        dVar4 = rlog1(&brcomp::e);
      }
      else {
        dVar9 = log(*y / brcomp::y0);
        dVar4 = dVar4 - dVar9;
      }
      brcomp::z = exp(-(*a * brcomp::u + dVar4 * *b));
      dVar4 = *b * brcomp::x0;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      local_48 = dVar4 * 0.398942280401433 * brcomp::z;
      dVar4 = bcorr(a,b);
      dVar4 = -dVar4;
    }
    else {
      dVar4 = *x;
      if (dVar4 <= 0.375) {
        brcomp::lnx = log(dVar4);
        brcomp::T1 = -*x;
        dVar4 = alnrel(&brcomp::T1);
      }
      else {
        if (*y <= 0.375) {
          brcomp::T2 = -*y;
          brcomp::lnx = alnrel(&brcomp::T2);
        }
        else {
          brcomp::lnx = log(dVar4);
        }
        dVar4 = log(*y);
      }
      dVar9 = *a;
      dVar5 = *b;
      dVar4 = brcomp::lnx * dVar9 + dVar4 * dVar5;
      brcomp::z = dVar4;
      if (1.0 <= brcomp::a0) {
        dVar4 = betaln(a,b);
        brcomp::z = brcomp::z - dVar4;
        dVar4 = exp(brcomp::z);
        return dVar4;
      }
      brcomp::b0 = dVar5;
      if (dVar5 <= dVar9) {
        brcomp::b0 = dVar9;
      }
      if (brcomp::b0 < 8.0) {
        if (1.0 < brcomp::b0) {
          brcomp::u = gamln1(&brcomp::a0);
          dVar9 = brcomp::b0 + -1.0;
          iVar3 = (int)dVar9;
          if (0 < iVar3) {
            dVar4 = 1.0;
            do {
              brcomp::b0 = brcomp::b0 + -1.0;
              dVar4 = dVar4 * (brcomp::b0 / (brcomp::b0 + brcomp::a0));
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            dVar4 = log(dVar4);
            brcomp::u = dVar4 + brcomp::u;
            dVar9 = brcomp::b0 + -1.0;
            dVar4 = brcomp::z;
          }
          dVar4 = dVar4 - brcomp::u;
          brcomp::apb = dVar9 + brcomp::a0;
          brcomp::b0 = dVar9;
          brcomp::z = dVar4;
          if (brcomp::apb <= 1.0) {
            dVar9 = gam1(&brcomp::apb);
            brcomp::t = dVar9 + 1.0;
          }
          else {
            brcomp::u = brcomp::apb + -1.0;
            dVar9 = gam1(&brcomp::u);
            brcomp::t = (dVar9 + 1.0) / brcomp::apb;
          }
          dVar9 = brcomp::a0;
          dVar4 = exp(dVar4);
          dVar5 = gam1(&brcomp::b0);
          return ((dVar5 + 1.0) * dVar4 * dVar9) / brcomp::t;
        }
        dVar4 = exp(dVar4);
        if ((dVar4 == 0.0) && (!NAN(dVar4))) {
          return dVar4;
        }
        brcomp::apb = *a + *b;
        if (brcomp::apb <= 1.0) {
          dVar9 = gam1(&brcomp::apb);
          dVar9 = dVar9 + 1.0;
        }
        else {
          brcomp::u = *a + *b + -1.0;
          dVar9 = gam1(&brcomp::u);
          dVar9 = (dVar9 + 1.0) / brcomp::apb;
        }
        brcomp::z = dVar9;
        dVar5 = gam1(a);
        dVar6 = gam1(b);
        auVar7._0_8_ = (dVar6 + 1.0) * (dVar5 + 1.0);
        auVar7._8_8_ = brcomp::a0;
        auVar1._8_8_ = brcomp::b0;
        auVar1._0_8_ = dVar9;
        auVar8 = divpd(auVar7,auVar1);
        return (dVar4 * brcomp::a0 * auVar8._0_8_) / (auVar8._8_8_ + 1.0);
      }
      dVar4 = gamln1(&brcomp::a0);
      dVar9 = algdiv(&brcomp::a0,&brcomp::b0);
      brcomp::u = dVar9 + dVar4;
      local_48 = brcomp::a0;
      dVar4 = brcomp::z - brcomp::u;
    }
    dVar4 = exp(dVar4);
    dVar4 = dVar4 * local_48;
  }
  return dVar4;
}

Assistant:

double brcomp(double *a,double *b,double *x,double *y)
/*
-----------------------------------------------------------------------
               EVALUATION OF X**A*Y**B/BETA(A,B)
-----------------------------------------------------------------------
*/
{
static double Const = .398942280401433e0;
static double brcomp,a0,apb,b0,c,e,h,lambda,lnx,lny,t,u,v,x0,y0,z;
static int i,n;
/*
-----------------
     CONST = 1/SQRT(2*PI)
-----------------
*/
static double T1,T2;
/*
     ..
     .. Executable Statements ..
*/
    brcomp = 0.0e0;
    if(*x == 0.0e0 || *y == 0.0e0) return brcomp;
    a0 = fifdmin1(*a,*b);
    if(a0 >= 8.0e0) goto S130;
    if(*x > 0.375e0) goto S10;
    lnx = log(*x);
    T1 = -*x;
    lny = alnrel(&T1);
    goto S30;
S10:
    if(*y > 0.375e0) goto S20;
    T2 = -*y;
    lnx = alnrel(&T2);
    lny = log(*y);
    goto S30;
S20:
    lnx = log(*x);
    lny = log(*y);
S30:
    z = *a*lnx+*b*lny;
    if(a0 < 1.0e0) goto S40;
    z -= betaln(a,b);
    brcomp = exp(z);
    return brcomp;
S40:
/*
-----------------------------------------------------------------------
              PROCEDURE FOR A .LT. 1 OR B .LT. 1
-----------------------------------------------------------------------
*/
    b0 = fifdmax1(*a,*b);
    if(b0 >= 8.0e0) goto S120;
    if(b0 > 1.0e0) goto S70;
/*
                   ALGORITHM FOR B0 .LE. 1
*/
    brcomp = exp(z);
    if(brcomp == 0.0e0) return brcomp;
    apb = *a+*b;
    if(apb > 1.0e0) goto S50;
    z = 1.0e0+gam1(&apb);
    goto S60;
S50:
    u = *a+*b-1.e0;
    z = (1.0e0+gam1(&u))/apb;
S60:
    c = (1.0e0+gam1(a))*(1.0e0+gam1(b))/z;
    brcomp = brcomp*(a0*c)/(1.0e0+a0/b0);
    return brcomp;
S70:
/*
                ALGORITHM FOR 1 .LT. B0 .LT. 8
*/
    u = gamln1(&a0);
    n = b0-1.0e0;
    if(n < 1) goto S90;
    c = 1.0e0;
    for(i=1; i<=n; i++) {
        b0 -= 1.0e0;
        c *= (b0/(a0+b0));
    }
    u = log(c)+u;
S90:
    z -= u;
    b0 -= 1.0e0;
    apb = a0+b0;
    if(apb > 1.0e0) goto S100;
    t = 1.0e0+gam1(&apb);
    goto S110;
S100:
    u = a0+b0-1.e0;
    t = (1.0e0+gam1(&u))/apb;
S110:
    brcomp = a0*exp(z)*(1.0e0+gam1(&b0))/t;
    return brcomp;
S120:
/*
                   ALGORITHM FOR B0 .GE. 8
*/
    u = gamln1(&a0)+algdiv(&a0,&b0);
    brcomp = a0*exp(z-u);
    return brcomp;
S130:
/*
-----------------------------------------------------------------------
              PROCEDURE FOR A .GE. 8 AND B .GE. 8
-----------------------------------------------------------------------
*/
    if(*a > *b) goto S140;
    h = *a/ *b;
    x0 = h/(1.0e0+h);
    y0 = 1.0e0/(1.0e0+h);
    lambda = *a-(*a+*b)**x;
    goto S150;
S140:
    h = *b/ *a;
    x0 = 1.0e0/(1.0e0+h);
    y0 = h/(1.0e0+h);
    lambda = (*a+*b)**y-*b;
S150:
    e = -(lambda/ *a);
    if(fabs(e) > 0.6e0) goto S160;
    u = rlog1(&e);
    goto S170;
S160:
    u = e-log(*x/x0);
S170:
    e = lambda/ *b;
    if(fabs(e) > 0.6e0) goto S180;
    v = rlog1(&e);
    goto S190;
S180:
    v = e-log(*y/y0);
S190:
    z = exp(-(*a*u+*b*v));
    brcomp = Const*sqrt(*b*x0)*z*exp(-bcorr(a,b));
    return brcomp;
}